

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O3

void __thiscall avro::Name::Name(Name *this,string *simpleName,string *ns)

{
  pointer pcVar1;
  
  (this->ns_)._M_dataplus._M_p = (pointer)&(this->ns_).field_2;
  pcVar1 = (ns->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + ns->_M_string_length);
  (this->simpleName_)._M_dataplus._M_p = (pointer)&(this->simpleName_).field_2;
  pcVar1 = (simpleName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->simpleName_,pcVar1,pcVar1 + simpleName->_M_string_length);
  check(this);
  return;
}

Assistant:

Name(const std::string& simpleName, const std::string& ns) : ns_(ns), simpleName_(simpleName) { check(); }